

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string_view bloaty::ReadUntil(string_view *data,char c)

{
  ulong __n;
  char *__s;
  void *pvVar1;
  ulong uVar2;
  undefined3 in_register_00000031;
  ulong uVar3;
  string_view sVar4;
  
  __n = data->_M_len;
  __s = data->_M_str;
  pvVar1 = memchr(__s,CONCAT31(in_register_00000031,c),__n);
  uVar2 = (long)pvVar1 - (long)__s;
  if (pvVar1 == (void *)0x0) {
    uVar2 = __n;
  }
  uVar3 = __n;
  if (uVar2 <= __n) {
    uVar3 = uVar2;
  }
  data->_M_str = __s + uVar2;
  data->_M_len = __n - uVar2;
  sVar4._M_str = __s;
  sVar4._M_len = uVar3;
  return sVar4;
}

Assistant:

std::string_view ReadUntil(std::string_view* data, char c) {
  const char* found =
      static_cast<const char*>(memchr(data->data(), c, data->size()));

  size_t len = (found == NULL) ? data->size() : (found - data->data());
  std::string_view val = data->substr(0, len);
  data->remove_prefix(len);
  return val;
}